

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_memory.cpp
# Opt level: O1

void __thiscall LiteScript::_BasicMemory_0::Remove(_BasicMemory_0 *this,uint id)

{
  ulong uVar1;
  
  uVar1 = (ulong)id;
  if ((this->free)._M_elems[uVar1] != -1) {
    return;
  }
  (this->free)._M_elems[uVar1] = this->first_free;
  this->first_free = (short)id;
  Object::~Object((Object *)(this->arr + uVar1 * 0x28));
  this->count = this->count - 1;
  return;
}

Assistant:

void LiteScript::_BasicMemory_0::Remove(unsigned int id) {
    if (this->free[id] != -1)
        return;
    this->free[id] = this->first_free;
    this->first_free = (short)id;
    this->allocator.destroy(&(*this)[id]);
    this->count--;
}